

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int os_date(lua_State *L)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  tm *stm;
  char *__s;
  size_t sVar4;
  char *option;
  char *pcVar5;
  int oplen;
  char cc [4];
  time_t t;
  luaL_Buffer b;
  
  __s1 = luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    t = time((time_t *)0x0);
  }
  else {
    t = luaL_checkinteger(L,2);
  }
  if (*__s1 == '!') {
    stm = (tm *)gmtime(&t);
    __s1 = __s1 + 1;
  }
  else {
    stm = (tm *)localtime(&t);
  }
  if (stm == (tm *)0x0) {
    luaL_error(L,"time result cannot be represented in this installation");
  }
  if (((*__s1 == '*') && (__s1[1] == 't')) && (__s1[2] == '\0')) {
    lua_createtable(L,0,9);
    setallfields(L,stm);
    return 1;
  }
  cc[0] = '%';
  luaL_buffinit(L,&b);
LAB_0011b582:
  for (; cVar1 = *__s1, cVar1 != '%'; __s1 = __s1 + 1) {
    if (cVar1 == '\0') {
      luaL_pushresult(&b);
      return 1;
    }
    if (b.size <= b.n) {
      luaL_prepbuffsize(&b,1);
      cVar1 = *__s1;
    }
    b.b[b.n] = cVar1;
    b.n = b.n + 1;
  }
  __s = luaL_prepbuffsize(&b,0xfa);
  __s1 = __s1 + 1;
  pcVar5 = "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy";
  iVar2 = 1;
  do {
    if (*pcVar5 == '|') {
      iVar2 = iVar2 + 1;
      sVar4 = (size_t)iVar2;
    }
    else {
      if (*pcVar5 == '\0') {
        pcVar5 = lua_pushfstring(L,"invalid conversion specifier \'%%%s\'",__s1);
        luaL_argerror(L,1,pcVar5);
        goto LAB_0011b65b;
      }
      sVar4 = (size_t)iVar2;
      iVar3 = bcmp(__s1,pcVar5,sVar4);
      if (iVar3 == 0) break;
    }
    pcVar5 = pcVar5 + sVar4;
  } while( true );
  memcpy(cc + 1,__s1,sVar4);
  cc[sVar4 + 1] = '\0';
  __s1 = __s1 + sVar4;
LAB_0011b65b:
  sVar4 = strftime(__s,0xfa,cc,(tm *)stm);
  b.n = b.n + sVar4;
  goto LAB_0011b582;
}

Assistant:

static int os_date (lua_State *L) {
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    luaL_error(L, "time result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (*s) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s = checkoption(L, s + 1, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}